

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ushort *puVar1;
  undefined1 uVar2;
  ulong uVar3;
  ma_uint32 mVar4;
  uint uVar5;
  ma_uint64 iSample;
  ma_uint64 mVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  bool bVar10;
  
  mVar6 = ma_dr_wav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (void *)0x0) {
    mVar4 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (mVar4 == 0) {
      mVar6 = 0;
    }
    else {
      uVar5 = mVar4 / pWav->channels;
      if (uVar5 - 2 < 7) {
        lVar9 = mVar6 * pWav->channels;
        switch(uVar5) {
        case 2:
          for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 1) {
            puVar1 = (ushort *)((long)pBufferOut + lVar7 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          }
          break;
        case 3:
          puVar8 = (undefined1 *)((long)pBufferOut + 2);
          while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
            uVar2 = puVar8[-2];
            puVar8[-2] = *puVar8;
            *puVar8 = uVar2;
            puVar8 = puVar8 + 3;
          }
          break;
        case 4:
          for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 1) {
            uVar5 = *(uint *)((long)pBufferOut + lVar7 * 4);
            *(uint *)((long)pBufferOut + lVar7 * 4) =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          }
          break;
        case 8:
          for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 1) {
            uVar3 = *(ulong *)((long)pBufferOut + lVar7 * 8);
            *(ulong *)((long)pBufferOut + lVar7 * 8) =
                 uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                 (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                 (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                 uVar3 << 0x38;
          }
        }
      }
    }
  }
  return mVar6;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL) {
        ma_uint32 bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return 0;
        }
        ma_dr_wav__bswap_samples(pBufferOut, framesRead*pWav->channels, bytesPerFrame/pWav->channels);
    }
    return framesRead;
}